

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportInvert(HighsSimplexAnalysis *this,bool header)

{
  type pbVar1;
  ostream *poVar2;
  byte in_SIL;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  if ((in_SIL & 1) == 0) {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*((unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
    poVar2 = std::operator<<((ostream *)(pbVar1 + 0x10)," ");
    std::operator<<(poVar2,(string *)(in_RDI + 0x120));
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportInvert(const bool header) {
  if (header) return;
  *analysis_log << " " << rebuild_reason_string;
}